

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_string_field_lite.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::ImmutableStringFieldLiteGenerator::GenerateParsingCode
          (ImmutableStringFieldLiteGenerator *this,Printer *printer)

{
  bool bVar1;
  Printer *printer_local;
  ImmutableStringFieldLiteGenerator *this_local;
  
  bVar1 = CheckUtf8(this->descriptor_);
  if (bVar1) {
    io::Printer::Print(printer,&this->variables_,
                       "String s = input.readStringRequireUtf8();\n$set_has_field_bit_message$\n$name$_ = s;\n"
                      );
  }
  else {
    io::Printer::Print(printer,&this->variables_,
                       "String s = input.readString();\n$set_has_field_bit_message$\n$name$_ = s;\n"
                      );
  }
  return;
}

Assistant:

void ImmutableStringFieldLiteGenerator::
GenerateParsingCode(io::Printer* printer) const {
  if (CheckUtf8(descriptor_)) {
    printer->Print(variables_,
      "String s = input.readStringRequireUtf8();\n"
      "$set_has_field_bit_message$\n"
      "$name$_ = s;\n");
  } else {
    // Lite runtime should attempt to reduce allocations by attempting to
    // construct the string directly from the input stream buffer. This avoids
    // spurious intermediary ByteString allocations, cutting overall allocations
    // in half.
    printer->Print(variables_,
      "String s = input.readString();\n"
      "$set_has_field_bit_message$\n"
      "$name$_ = s;\n");
  }
}